

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeDefUse(DefUseManager *this,Module *module)

{
  Module *this_00;
  DefUseManager *local_b8;
  code *local_b0;
  undefined8 local_a8;
  type local_a0;
  function<void_(spvtools::opt::Instruction_*)> local_88;
  DefUseManager *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  function<void_(spvtools::opt::Instruction_*)> local_38;
  Module *local_18;
  Module *module_local;
  DefUseManager *this_local;
  
  if (module != (Module *)0x0) {
    local_60 = AnalyzeInstDef;
    local_58 = 0;
    local_68 = this;
    local_18 = module;
    module_local = (Module *)this;
    std::
    bind<void(spvtools::opt::analysis::DefUseManager::*)(spvtools::opt::Instruction*),spvtools::opt::analysis::DefUseManager*,std::_Placeholder<1>const&>
              (&local_50,(offset_in_DefUseManager_to_subr *)&local_60,&local_68,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<void(spvtools::opt::Instruction*)>::
    function<std::_Bind<void(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager*,std::_Placeholder<1>))(spvtools::opt::Instruction*)>,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_38,&local_50);
    Module::ForEachInst(module,&local_38,true);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_38);
    this_00 = local_18;
    local_b0 = AnalyzeInstUse;
    local_a8 = 0;
    local_b8 = this;
    std::
    bind<void(spvtools::opt::analysis::DefUseManager::*)(spvtools::opt::Instruction*),spvtools::opt::analysis::DefUseManager*,std::_Placeholder<1>const&>
              (&local_a0,(offset_in_DefUseManager_to_subr *)&local_b0,&local_b8,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<void(spvtools::opt::Instruction*)>::
    function<std::_Bind<void(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager*,std::_Placeholder<1>))(spvtools::opt::Instruction*)>,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_88,&local_a0);
    Module::ForEachInst(this_00,&local_88,true);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_88);
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeDefUse(Module* module) {
  if (!module) return;
  // Analyze all the defs before any uses to catch forward references.
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstDef, this, std::placeholders::_1),
      true);
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstUse, this, std::placeholders::_1),
      true);
}